

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

void __thiscall Visualizer::generateDot(Visualizer *this,ASTNode *root)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  long *plVar6;
  string *psVar7;
  undefined8 *puVar8;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar9;
  ulong *puVar10;
  long *plVar11;
  ulong uVar12;
  _Elt_pointer ppAVar13;
  uint uVar14;
  string __str;
  string __str_2;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ASTNode *local_90;
  long *local_88 [2];
  long local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  _Map_pointer local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  local_90 = root;
  puVar5 = (uint *)AST::ASTNode::getUniqueID(root);
  uVar1 = *puVar5;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar14 = 1;
  if (9 < uVar2) {
    uVar12 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar14 = uVar3;
      uVar4 = (uint)uVar12;
      if (uVar4 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0012544a;
      }
      if (uVar4 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0012544a;
      }
      if (uVar4 < 10000) goto LAB_0012544a;
      uVar12 = uVar12 / 10000;
      uVar3 = uVar14 + 4;
    } while (99999 < uVar4);
    uVar14 = uVar14 + 1;
  }
LAB_0012544a:
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct((ulong)local_88,(char)uVar14 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_88[0] + (ulong)(uVar1 >> 0x1f)),uVar14,uVar2);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_88);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_e0 = *puVar10;
    lStack_d8 = plVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar10;
    local_f0 = (ulong *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  psVar7 = AST::ASTNode::getName_abi_cxx11_(local_90);
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(psVar7->_M_dataplus)._M_p);
  plVar6 = puVar8 + 2;
  if ((long *)*puVar8 == plVar6) {
    local_c0 = *plVar6;
    uStack_b8 = puVar8[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
    local_d0 = (long *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_a0 = *plVar11;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar11;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  pdVar9 = AST::ASTNode::getChildren(local_90);
  if ((pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pdVar9 = AST::ASTNode::getChildren(local_90);
    ppAVar13 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    local_38 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar13 != local_38) {
      local_40 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      local_48 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar5 = (uint *)AST::ASTNode::getUniqueID(local_90);
        uVar1 = *puVar5;
        uVar2 = -uVar1;
        if (0 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar14 = 1;
        if (9 < uVar2) {
          uVar12 = (ulong)uVar2;
          uVar3 = 4;
          do {
            uVar14 = uVar3;
            uVar4 = (uint)uVar12;
            if (uVar4 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_001256c3;
            }
            if (uVar4 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_001256c3;
            }
            if (uVar4 < 10000) goto LAB_001256c3;
            uVar12 = uVar12 / 10000;
            uVar3 = uVar14 + 4;
          } while (99999 < uVar4);
          uVar14 = uVar14 + 1;
        }
LAB_001256c3:
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct
                  ((ulong)local_88,(char)uVar14 - (char)((int)uVar1 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_88[0] + (ulong)(uVar1 >> 0x1f)),uVar14,uVar2);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_88);
        local_f0 = &local_e0;
        puVar10 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar10) {
          local_e0 = *puVar10;
          lStack_d8 = plVar6[3];
        }
        else {
          local_e0 = *puVar10;
          local_f0 = (ulong *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar5 = (uint *)AST::ASTNode::getUniqueID(*ppAVar13);
        uVar1 = *puVar5;
        uVar2 = -uVar1;
        if (0 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar14 = 1;
        if (9 < uVar2) {
          uVar12 = (ulong)uVar2;
          uVar3 = 4;
          do {
            uVar14 = uVar3;
            uVar4 = (uint)uVar12;
            if (uVar4 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_001257bb;
            }
            if (uVar4 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_001257bb;
            }
            if (uVar4 < 10000) goto LAB_001257bb;
            uVar12 = uVar12 / 10000;
            uVar3 = uVar14 + 4;
          } while (99999 < uVar4);
          uVar14 = uVar14 + 1;
        }
LAB_001257bb:
        local_68 = local_58;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_68,(char)uVar14 - (char)((int)uVar1 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_68),uVar14,uVar2);
        uVar12 = 0xf;
        if (local_f0 != &local_e0) {
          uVar12 = local_e0;
        }
        if (uVar12 < (ulong)(local_60 + local_e8)) {
          uVar12 = 0xf;
          if (local_68 != local_58) {
            uVar12 = local_58[0];
          }
          if (uVar12 < (ulong)(local_60 + local_e8)) goto LAB_0012585b;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_0012585b:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_68);
        }
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_c0 = *plVar6;
          uStack_b8 = puVar8[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*puVar8;
        }
        local_c8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          local_a0 = *plVar11;
          lStack_98 = plVar6[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar11;
          local_b0 = (long *)*plVar6;
        }
        local_a8 = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)this,(ulong)local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        generateDot(this,*ppAVar13);
        ppAVar13 = ppAVar13 + 1;
        if (ppAVar13 == local_40) {
          ppAVar13 = local_48[1];
          local_48 = local_48 + 1;
          local_40 = ppAVar13 + 0x40;
        }
      } while (ppAVar13 != local_38);
    }
  }
  return;
}

Assistant:

void Visualizer::generateDot(AST::ASTNode *root) {
    dotFileContent += std::to_string(root->getUniqueID()) + " [label=\"" + root->getName() + "\"];\n";
    if (root->getChildren().empty()) return;
    for (const auto &child: root->getChildren()) {
        dotFileContent += std::to_string(root->getUniqueID()) + " -> " + std::to_string(child->getUniqueID()) + ";\n";
        generateDot(child);
    }
}